

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleTable::cellAt(QAccessibleTable *this,int row,int column)

{
  bool bVar1;
  int iVar2;
  QModelIndex *index_00;
  QModelIndex *this_00;
  QDebug *pQVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex index;
  char *in_stack_ffffffffffffff38;
  QModelIndex *this_01;
  undefined4 uVar4;
  undefined4 uVar5;
  QAccessibleInterface *local_88;
  char *in_stack_ffffffffffffff88;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug in_stack_ffffffffffffffb8;
  QDebug in_stack_ffffffffffffffc0;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = (QModelIndex *)view((QAccessibleTable *)0x7f30b8);
  this_00 = (QModelIndex *)QAbstractItemView::model(in_RDI);
  if (this_00 == (QModelIndex *)0x0) {
    local_88 = (QAccessibleInterface *)0x0;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    this_01 = this_00;
    uVar4 = in_EDX;
    uVar5 = in_ESI;
    QAbstractItemView::rootIndex((QAbstractItemView *)this_00);
    (**(code **)(*(long *)this_00 + 0x60))(&local_20,this_00,in_ESI,in_EDX,local_38);
    bVar1 = QModelIndex::isValid(this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      iVar2 = logicalIndex((QAccessibleTable *)CONCAT44(uVar5,uVar4),index_00);
      local_88 = (QAccessibleInterface *)
                 (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.
                                        super_QWidget + 0x100))(in_RDI,iVar2);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)CONCAT44(in_EDX,in_ESI),
                 (int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff38);
      QMessageLogger::warning();
      pQVar3 = QDebug::operator<<((QDebug *)this_01,in_stack_ffffffffffffff88);
      QDebug::QDebug(&local_58,pQVar3);
      ::operator<<((QDebug *)&local_50,(QModelIndex *)&local_58);
      pQVar3 = QDebug::operator<<((QDebug *)this_01,in_stack_ffffffffffffff88);
      QDebug::QDebug((QDebug *)&stack0xffffffffffffffb8,pQVar3);
      ::operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,
                   (QWidget *)in_stack_ffffffffffffffb8.stream);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffb8);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      local_88 = (QAccessibleInterface *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_88;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::cellAt(int row, int column) const
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;
    Q_ASSERT(role() != QAccessible::List);
    Q_ASSERT(role() != QAccessible::Tree);
    QModelIndex index = theModel->index(row, column, theView->rootIndex());
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning() << "QAccessibleTable::cellAt: invalid index: " << index << " for " << theView;
        return nullptr;
    }
    return child(logicalIndex(index));
}